

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

libcaption_stauts_t caption_frame_carriage_return(caption_frame_t *frame)

{
  int iVar1;
  caption_frame_cell_t *pcVar2;
  caption_frame_cell_t *__src;
  caption_frame_t *in_RDI;
  caption_frame_cell_t *cell;
  uint8_t *src;
  uint8_t *dst;
  int r;
  int local_14;
  libcaption_stauts_t local_4;
  
  if (((in_RDI->state).row < '\0') || ('\x0e' < (in_RDI->state).row)) {
    local_4 = LIBCAPTION_ERROR;
  }
  else {
    local_14 = (int)(in_RDI->state).row - ((*(byte *)&in_RDI->state >> 4 & 3) - 1);
    if ((local_14 < 1) || (iVar1 = caption_frame_rollup(in_RDI), iVar1 == 0)) {
      local_4 = LIBCAPTION_OK;
    }
    else {
      for (; local_14 < 0xf; local_14 = local_14 + 1) {
        pcVar2 = frame_buffer_cell(in_RDI->write,local_14 + -1,0);
        __src = frame_buffer_cell(in_RDI->write,local_14,0);
        memcpy(pcVar2,__src,0x100);
      }
      (in_RDI->state).col = '\0';
      pcVar2 = frame_buffer_cell(in_RDI->write,0xe,0);
      memset(pcVar2,0,0x100);
      local_4 = LIBCAPTION_OK;
    }
  }
  return local_4;
}

Assistant:

libcaption_stauts_t caption_frame_carriage_return(caption_frame_t* frame)
{
    if (0 > frame->state.row || SCREEN_ROWS <= frame->state.row) {
        return LIBCAPTION_ERROR;
    }

    int r = frame->state.row - (frame->state.rup - 1);

    if (0 >= r || !caption_frame_rollup(frame)) {
        return LIBCAPTION_OK;
    }

    for (; r < SCREEN_ROWS; ++r) {
        uint8_t* dst = (uint8_t*)frame_buffer_cell(frame->write, r - 1, 0);
        uint8_t* src = (uint8_t*)frame_buffer_cell(frame->write, r - 0, 0);
        memcpy(dst, src, sizeof(caption_frame_cell_t) * SCREEN_COLS);
    }

    frame->state.col = 0;
    caption_frame_cell_t* cell = frame_buffer_cell(frame->write, SCREEN_ROWS - 1, 0);
    memset(cell, 0, sizeof(caption_frame_cell_t) * SCREEN_COLS);
    return LIBCAPTION_OK;
}